

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

TRef snap_pref(jit_State *J,GCtrace *T,SnapEntry *map,MSize nmax,BloomFilter seen,IRRef ref)

{
  GCRef *pGVar1;
  uint uVar2;
  TRef TVar3;
  ulong uVar4;
  
  pGVar1 = &T->nextgc + (ulong)ref * 2;
  if (ref < 0x8000) {
    uVar2 = 0x7fff;
    switch(*(uint8_t *)((long)(pGVar1 + 1) + 1)) {
    case '\x16':
      uVar2 = ((*(byte *)(pGVar1 + 1) & 0x1f) << 0x18 | *(byte *)(pGVar1 + 1) & 0x1f) ^ 0x7fff;
      break;
    case '\x17':
      TVar3 = lj_ir_kint(J,pGVar1->gcptr32);
      return TVar3;
    case '\x18':
      TVar3 = lj_ir_kgc(J,(GCobj *)(ulong)pGVar1->gcptr32,(uint)*(byte *)(pGVar1 + 1));
      return TVar3;
    case '\x19':
      TVar3 = lj_ir_kptr_(J,IR_KPTR,(void *)(ulong)pGVar1->gcptr32);
      return TVar3;
    case '\x1b':
      TVar3 = lj_ir_knull(J,*(byte *)(pGVar1 + 1) & IRT_TYPE);
      return TVar3;
    case '\x1c':
    case '\x1d':
      TVar3 = lj_ir_k64(J,(uint)*(uint8_t *)((long)(pGVar1 + 1) + 1),*(uint64_t *)(pGVar1 + 2));
      return TVar3;
    }
    return uVar2;
  }
  if ((*(uint16_t *)((long)(pGVar1 + 1) + 2) & 0xff80) == 0x80) {
    return 0;
  }
  if ((nmax != 0) && ((1L << ((byte)ref & 0x3f) & seen) != 0)) {
    uVar4 = 0;
    do {
      if ((map[uVar4] & 0xffff) == ref) {
        uVar2 = J->slot[map[uVar4] >> 0x18] & 0xfffcffff;
        if (uVar2 != 0) {
          return uVar2;
        }
        break;
      }
      uVar4 = uVar4 + 1;
    } while (nmax != uVar4);
  }
  (J->fold).ins.field_0.ot = *(byte *)(pGVar1 + 1) & 0x1f | 0xe00;
  (J->fold).ins.field_0.op1 = (ushort)ref ^ 0x8000;
  (J->fold).ins.field_0.op2 = 0;
  TVar3 = lj_opt_fold(J);
  return TVar3;
}

Assistant:

static TRef snap_pref(jit_State *J, GCtrace *T, SnapEntry *map, MSize nmax,
		      BloomFilter seen, IRRef ref)
{
  IRIns *ir = &T->ir[ref];
  TRef tr;
  if (irref_isk(ref))
    tr = snap_replay_const(J, ir);
  else if (!regsp_used(ir->prev))
    tr = 0;
  else if (!bloomtest(seen, ref) || (tr = snap_dedup(J, map, nmax, ref)) == 0)
    tr = emitir(IRT(IR_PVAL, irt_type(ir->t)), ref - REF_BIAS, 0);
  return tr;
}